

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem-C-API.cpp
# Opt level: O0

bool anon_unknown.dwarf_5b8e::fs_get_file_contents(void *context,char *path,llb_data_t *data_out)

{
  FILE *__stream;
  size_t size_00;
  uint8_t *__ptr;
  size_t sVar1;
  int n;
  uint8_t *buffer;
  long size;
  FILE *fp;
  llb_data_t *data_out_local;
  char *path_local;
  void *context_local;
  
  printf(" -- read file contents: %s\n",path);
  fflush(_stdout);
  __stream = fopen(path,"rb");
  if (__stream == (FILE *)0x0) {
    context_local._7_1_ = false;
  }
  else {
    fseek(__stream,0,2);
    size_00 = ftell(__stream);
    fseek(__stream,0,0);
    __ptr = (uint8_t *)llb_alloc(size_00);
    if (__ptr == (uint8_t *)0x0) {
      context_local._7_1_ = false;
    }
    else {
      data_out->data = __ptr;
      data_out->length = size_00;
      sVar1 = fread(__ptr,1,size_00,__stream);
      if ((long)(int)sVar1 == size_00) {
        context_local._7_1_ = true;
      }
      else {
        context_local._7_1_ = false;
      }
    }
  }
  return context_local._7_1_;
}

Assistant:

static bool fs_get_file_contents(void* context, const char* path,
                                llb_data_t* data_out) {
#if defined(_WIN32)
  llvm::SmallVector<llvm::UTF16, 20> wPath;
  llvm::convertUTF8ToUTF16String(path, wPath);
  wprintf(L" -- read file contents: %ls\n", (LPCWSTR)wPath.data());
  fflush(stdout);
  FILE* fp;
  if (_wfopen_s(&fp, (LPCWSTR)wPath.data(), L"rb")) {
    return false;
  }
#else
  printf(" -- read file contents: %s\n", path);
  fflush(stdout);

  FILE *fp = fopen(path, "rb");
  if (!fp) {
    return false;
  }
#endif

  fseek(fp, 0, SEEK_END);
  long size = ftell(fp);
  fseek(fp, 0, SEEK_SET);
  uint8_t* buffer = (uint8_t*)llb_alloc(size);
  if (!buffer) {
    return false;
  }
  data_out->data = buffer;
  data_out->length = size;
  int n = fread(buffer, 1, size, fp);
  if (n != size) {
    return false;
  }
  
  return true;
}